

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# io.c
# Opt level: O2

void rd_1dim_slice(char **content,size_t *line_no,int *array,int dim,int shift,int post)

{
  size_t sVar1;
  char *__haystack;
  int *piVar2;
  int iVar3;
  char *__haystack_00;
  char *pcVar4;
  long lVar5;
  uint uVar6;
  uint uVar7;
  ulong uVar8;
  uint uVar9;
  double dVar10;
  int p;
  uint local_68;
  int pp;
  int *local_60;
  uint local_58 [4];
  double local_48;
  char **local_40;
  size_t *local_38;
  
  local_60 = array + shift;
  uVar6 = dim - (shift + post);
  local_68 = 0;
  uVar7 = 0;
  local_40 = content;
  local_38 = line_no;
LAB_0012272b:
  if ((int)uVar6 <= (int)uVar7) {
    return;
  }
  sVar1 = *local_38;
  *local_38 = sVar1 + 1;
  __haystack = local_40[sVar1];
  if (__haystack == (char *)0x0) {
    vrna_message_error("unexpected end of file in get_array1");
  }
  __haystack_00 = strstr(__haystack,"/*");
  if (__haystack_00 != (char *)0x0) {
    pcVar4 = strstr(__haystack_00,"*/");
    if (pcVar4 == (char *)0x0) {
      vrna_message_error("unclosed comment in parameter file");
    }
    for (lVar5 = 0; pcVar4[lVar5 + 2] != '\0'; lVar5 = lVar5 + 1) {
      __haystack_00[lVar5] = pcVar4[lVar5 + 2];
    }
    __haystack_00[lVar5] = '\0';
  }
  lVar5 = 0;
  uVar9 = uVar7;
  do {
    uVar8 = (ulong)uVar9;
    while( true ) {
      uVar7 = (uint)uVar8;
      if ((int)uVar6 <= (int)uVar7) {
        uVar7 = uVar9;
        if ((int)uVar9 <= (int)uVar6) {
          uVar7 = uVar6;
        }
        goto LAB_0012272b;
      }
      iVar3 = __isoc99_sscanf(__haystack + (int)lVar5,"%15s%n",local_58,&pp);
      piVar2 = local_60;
      if (iVar3 != 1) goto LAB_0012272b;
      lVar5 = (long)pp + (long)(int)lVar5;
      if ((local_58[0] & 0xff) != 0x2a) break;
      uVar8 = uVar8 + 1;
    }
    if ((local_58[0] & 0xff) == 0x78) {
      if (uVar7 == 0) {
        vrna_message_error("can\'t extrapolate first value");
      }
      iVar3 = piVar2[local_68];
      local_48 = lxc37;
      dVar10 = log((double)(int)uVar7 / (double)(int)local_68);
      p = (int)(dVar10 * local_48 + 0.5) + iVar3;
      uVar9 = local_68;
    }
    else {
      uVar9 = local_68;
      if (local_58[0] == 0x54534e) {
        p = 0;
      }
      else if (local_58[0] == 0x464e49) {
        p = 10000000;
      }
      else if (local_58[0] == 0x464544) {
        p = -0x32;
      }
      else {
        iVar3 = __isoc99_sscanf(local_58,"%d",&p);
        uVar9 = uVar7;
        if (iVar3 != 1) {
          if (__haystack == (char *)0x0) {
            return;
          }
          vrna_message_error("\nrd_1dim: %s",__haystack + lVar5);
          exit(1);
        }
      }
    }
    local_68 = uVar9;
    uVar9 = uVar7 + 1;
    piVar2[uVar8] = p;
  } while( true );
}

Assistant:

PRIVATE void
rd_1dim_slice(char    **content,
              size_t  *line_no,
              int     *array,
              int     dim,
              int     shift,
              int     post)
{
  char *cp;

  cp = get_array1(content, line_no, array + shift, dim - shift - post);

  if (cp) {
    vrna_message_error("\nrd_1dim: %s", cp);
    exit(1);
  }

  return;
}